

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::install_signal_handlers(SignalOptions *signal_options)

{
  int iVar1;
  undefined1 local_a8 [8];
  sigaction sig_action;
  SignalOptions *signal_options_local;
  
  s_signal_options = *signal_options;
  sig_action.sa_restorer = (_func_void *)signal_options;
  memset(local_a8,0,0x98);
  sigemptyset((sigset_t *)&sig_action);
  sig_action.sa_mask.__val[0xf]._0_4_ = (uint)sig_action.sa_mask.__val[0xf] | 4;
  local_a8 = (undefined1  [8])signal_handler;
  if ((((byte)sig_action.sa_restorer[1] & 1) != 0) &&
     (iVar1 = sigaction(6,(sigaction *)local_a8,(sigaction *)0x0), iVar1 == -1)) {
    log_and_abort(0,"CHECK FAILED:  sigaction(SIGABRT, &sig_action, NULL) != -1  ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x738,"Failed to install handler for SIGABRT");
  }
  if ((((byte)sig_action.sa_restorer[2] & 1) != 0) &&
     (iVar1 = sigaction(7,(sigaction *)local_a8,(sigaction *)0x0), iVar1 == -1)) {
    log_and_abort(0,"CHECK FAILED:  sigaction(SIGBUS, &sig_action, NULL) != -1  ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x73b,"Failed to install handler for SIGBUS");
  }
  if ((((byte)sig_action.sa_restorer[3] & 1) != 0) &&
     (iVar1 = sigaction(8,(sigaction *)local_a8,(sigaction *)0x0), iVar1 == -1)) {
    log_and_abort(0,"CHECK FAILED:  sigaction(SIGFPE, &sig_action, NULL) != -1  ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x73e,"Failed to install handler for SIGFPE");
  }
  if ((((byte)sig_action.sa_restorer[4] & 1) != 0) &&
     (iVar1 = sigaction(4,(sigaction *)local_a8,(sigaction *)0x0), iVar1 == -1)) {
    log_and_abort(0,"CHECK FAILED:  sigaction(SIGILL, &sig_action, NULL) != -1  ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x741,"Failed to install handler for SIGILL");
  }
  if ((((byte)sig_action.sa_restorer[5] & 1) != 0) &&
     (iVar1 = sigaction(2,(sigaction *)local_a8,(sigaction *)0x0), iVar1 == -1)) {
    log_and_abort(0,"CHECK FAILED:  sigaction(SIGINT, &sig_action, NULL) != -1  ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x744,"Failed to install handler for SIGINT");
  }
  if ((((byte)sig_action.sa_restorer[6] & 1) != 0) &&
     (iVar1 = sigaction(0xb,(sigaction *)local_a8,(sigaction *)0x0), iVar1 == -1)) {
    log_and_abort(0,"CHECK FAILED:  sigaction(SIGSEGV, &sig_action, NULL) != -1  ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x747,"Failed to install handler for SIGSEGV");
  }
  if ((((byte)sig_action.sa_restorer[7] & 1) != 0) &&
     (iVar1 = sigaction(0xf,(sigaction *)local_a8,(sigaction *)0x0), iVar1 == -1)) {
    log_and_abort(0,"CHECK FAILED:  sigaction(SIGTERM, &sig_action, NULL) != -1  ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x74a,"Failed to install handler for SIGTERM");
  }
  return;
}

Assistant:

void install_signal_handlers(const SignalOptions& signal_options)
	{
		s_signal_options = signal_options;

		struct sigaction sig_action;
		memset(&sig_action, 0, sizeof(sig_action));
		sigemptyset(&sig_action.sa_mask);
		sig_action.sa_flags |= SA_SIGINFO;
		sig_action.sa_sigaction = &signal_handler;

		if (signal_options.sigabrt) {
			CHECK_F(sigaction(SIGABRT, &sig_action, NULL) != -1, "Failed to install handler for SIGABRT");
		}
		if (signal_options.sigbus) {
			CHECK_F(sigaction(SIGBUS, &sig_action, NULL) != -1, "Failed to install handler for SIGBUS");
		}
		if (signal_options.sigfpe) {
			CHECK_F(sigaction(SIGFPE, &sig_action, NULL) != -1, "Failed to install handler for SIGFPE");
		}
		if (signal_options.sigill) {
			CHECK_F(sigaction(SIGILL, &sig_action, NULL) != -1, "Failed to install handler for SIGILL");
		}
		if (signal_options.sigint) {
			CHECK_F(sigaction(SIGINT, &sig_action, NULL) != -1, "Failed to install handler for SIGINT");
		}
		if (signal_options.sigsegv) {
			CHECK_F(sigaction(SIGSEGV, &sig_action, NULL) != -1, "Failed to install handler for SIGSEGV");
		}
		if (signal_options.sigterm) {
			CHECK_F(sigaction(SIGTERM, &sig_action, NULL) != -1, "Failed to install handler for SIGTERM");
		}
	}